

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O0

CURLcode rtsp_done(Curl_easy *data,CURLcode status,_Bool premature)

{
  FILEPROTO *pFVar1;
  char *pcVar2;
  long CSeq_recv;
  long CSeq_sent;
  CURLcode httpStatus;
  RTSP *rtsp;
  _Bool premature_local;
  CURLcode status_local;
  Curl_easy *data_local;
  
  pFVar1 = (data->req).p.file;
  rtsp._3_1_ = premature;
  if ((data->set).rtspreq == RTSPREQ_RECEIVE) {
    rtsp._3_1_ = 1;
  }
  data_local._4_4_ = Curl_http_done(data,status,(_Bool)(rtsp._3_1_ & 1));
  if (((pFVar1 != (FILEPROTO *)0x0) && (status == CURLE_OK)) && (data_local._4_4_ == CURLE_OK)) {
    pcVar2 = pFVar1->freepath;
    if (((data->set).rtspreq == RTSPREQ_RECEIVE) || (pFVar1->path == pcVar2)) {
      if (((((data->set).rtspreq == RTSPREQ_RECEIVE) &&
           ((data->conn->proto).rtspc.rtp_channel == -1)) &&
          ((data != (Curl_easy *)0x0 && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))))
         && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))))
      {
        Curl_infof(data,"Got an RTP Receive with a CSeq of %ld",pcVar2);
      }
      if (((data->set).rtspreq == RTSPREQ_RECEIVE) &&
         ((*(uint *)&(data->req).field_0xd1 >> 4 & 1) != 0)) {
        Curl_failf(data,"Server prematurely closed the RTSP connection.");
        data_local._4_4_ = CURLE_RECV_ERROR;
      }
    }
    else {
      Curl_failf(data,"The CSeq of this request %ld did not match the response %ld",pFVar1->path,
                 pcVar2);
      data_local._4_4_ = CURLE_RTSP_CSEQ_ERROR;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode rtsp_done(struct Curl_easy *data,
                          CURLcode status, bool premature)
{
  struct RTSP *rtsp = data->req.p.rtsp;
  CURLcode httpStatus;

  /* Bypass HTTP empty-reply checks on receive */
  if(data->set.rtspreq == RTSPREQ_RECEIVE)
    premature = TRUE;

  httpStatus = Curl_http_done(data, status, premature);

  if(rtsp && !status && !httpStatus) {
    /* Check the sequence numbers */
    long CSeq_sent = rtsp->CSeq_sent;
    long CSeq_recv = rtsp->CSeq_recv;
    if((data->set.rtspreq != RTSPREQ_RECEIVE) && (CSeq_sent != CSeq_recv)) {
      failf(data,
            "The CSeq of this request %ld did not match the response %ld",
            CSeq_sent, CSeq_recv);
      return CURLE_RTSP_CSEQ_ERROR;
    }
    if(data->set.rtspreq == RTSPREQ_RECEIVE &&
       (data->conn->proto.rtspc.rtp_channel == -1)) {
      infof(data, "Got an RTP Receive with a CSeq of %ld", CSeq_recv);
    }
    if(data->set.rtspreq == RTSPREQ_RECEIVE &&
       data->req.eos_written) {
      failf(data, "Server prematurely closed the RTSP connection.");
      return CURLE_RECV_ERROR;
    }
  }

  return httpStatus;
}